

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  byte bVar1;
  xmlNodeSetPtr cur;
  xmlChar *ID;
  _xmlNode *val;
  byte *pbVar2;
  int len;
  
  if (ids != (xmlChar *)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    pbVar2 = ids;
    if (cur != (xmlNodeSetPtr)0x0) {
      while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
        pbVar2 = pbVar2 + 1;
      }
      bVar1 = *pbVar2;
      while (bVar1 != 0) {
        len = (int)pbVar2 - (int)ids;
        while ((0x20 < (ulong)*pbVar2 || ((0x100002601U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))) {
          pbVar2 = pbVar2 + 1;
          len = len + 1;
        }
        ID = xmlStrndup(ids,len);
        if (ID != (xmlChar *)0x0) {
          val = (_xmlNode *)xmlGetID(doc,ID);
          if (val != (xmlNodePtr)0x0) {
            if (val->type != XML_ELEMENT_NODE) {
              if (val->type == XML_ATTRIBUTE_NODE) {
                val = val->parent;
              }
              else {
                val = (xmlNodePtr)0x0;
              }
            }
            if (val != (xmlNodePtr)0x0) {
              xmlXPathNodeSetAdd(cur,val);
            }
          }
          (*xmlFree)(ID);
        }
        while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
          pbVar2 = pbVar2 + 1;
        }
        ids = pbVar2;
        bVar1 = *pbVar2;
      }
      return cur;
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID != NULL) {
	    /*
	     * We used to check the fact that the value passed
	     * was an NCName, but this generated much troubles for
	     * me and Aleksey Sanin, people blatantly violated that
	     * constraint, like Visa3D spec.
	     * if (xmlValidateNCName(ID, 1) == 0)
	     */
	    attr = xmlGetID(doc, ID);
	    if (attr != NULL) {
		if (attr->type == XML_ATTRIBUTE_NODE)
		    elem = attr->parent;
		else if (attr->type == XML_ELEMENT_NODE)
		    elem = (xmlNodePtr) attr;
		else
		    elem = NULL;
                /* TODO: Check memory error. */
		if (elem != NULL)
		    xmlXPathNodeSetAdd(ret, elem);
	    }
	    xmlFree(ID);
	}

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}